

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  long lVar1;
  undefined8 uVar2;
  Curl_addrinfo *pCVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  _Bool _Var11;
  uint uVar12;
  CURLcode CVar13;
  CURLcode CVar14;
  timediff_t tVar15;
  int *piVar16;
  char *pcVar17;
  Curl_easy *pCVar18;
  uint uVar19;
  long lVar20;
  curltime cVar21;
  curltime older;
  curltime newer;
  curltime newer_00;
  int error;
  char ipaddress [46];
  int local_a8;
  int local_a4;
  CURLcode local_a0;
  uint local_9c;
  curltime local_98;
  _Bool *local_88;
  long local_80;
  Curl_easy *local_78;
  ulong local_70;
  char local_68 [56];
  
  pCVar18 = conn->data;
  local_a8 = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
LAB_00441b64:
    CVar13 = CURLE_OK;
  }
  else {
    local_a4 = sockindex;
    cVar21 = Curl_now();
    local_98.tv_sec = cVar21.tv_sec;
    local_98.tv_usec = cVar21.tv_usec;
    local_70 = Curl_timeleft(pCVar18,&local_98,true);
    if ((long)local_70 < 0) {
      Curl_failf(pCVar18,"Connection time-out");
      CVar13 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      lVar20 = 0;
      local_a0 = CURLE_OK;
      local_88 = connected;
      local_80 = (long)sockindex;
      local_78 = pCVar18;
      bVar10 = true;
      do {
        bVar8 = bVar10;
        if (conn->tempsock[lVar20] != -1) {
          uVar19 = (uint)lVar20 ^ 1;
          uVar12 = Curl_socket_check(-1,-1,conn->tempsock[lVar20],0);
          if (uVar12 == 2) {
LAB_00441c8d:
            _Var11 = verifyconnect(conn->tempsock[lVar20],&local_a8);
            lVar1 = local_80;
            if (_Var11) {
              conn->sock[local_80] = conn->tempsock[lVar20];
              pCVar3 = conn->tempaddr[lVar20];
              conn->ip_addr = pCVar3;
              conn->tempsock[lVar20] = -1;
              (conn->bits).ipv6 = pCVar3->ai_family == 10;
              if (conn->tempsock[uVar19] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar19]);
                conn->tempsock[uVar19] = -1;
              }
              CVar13 = Curl_connected_proxy(conn,local_a4);
              if (CVar13 != CURLE_OK) {
                return CVar13;
              }
              (conn->bits).tcpconnect[lVar1] = true;
              *local_88 = true;
              if (local_a4 == 0) {
                Curl_pgrsTime(pCVar18,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar1]);
              Curl_verboseconnect(conn);
              goto LAB_00441b64;
            }
            Curl_infof(pCVar18,"Connection failed\n");
          }
          else if (uVar12 == 0) {
            local_a8 = 0;
            newer.tv_usec = local_98.tv_usec;
            newer.tv_sec = local_98.tv_sec;
            uVar4 = (conn->connecttime).tv_sec;
            uVar5 = (conn->connecttime).tv_usec;
            cVar21.tv_usec = uVar5;
            cVar21.tv_sec = uVar4;
            cVar21._12_4_ = 0;
            newer._12_4_ = 0;
            tVar15 = Curl_timediff(newer,cVar21);
            if (conn->timeoutms_per_addr <= tVar15) {
              Curl_infof(pCVar18,"After %ldms connect time, move on!\n");
              local_a8 = 0x6e;
            }
            if (((bVar8) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer_00.tv_usec = local_98.tv_usec, newer_00.tv_sec = local_98.tv_sec,
               uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
               older.tv_usec = uVar7, older.tv_sec = uVar6, older._12_4_ = 0, newer_00._12_4_ = 0,
               tVar15 = Curl_timediff(newer_00,older),
               (pCVar18->set).happy_eyeballs_timeout <= tVar15)) {
              trynextip(conn,local_a4,1);
            }
          }
          else {
            if ((conn->bits).tcp_fastopen == true) goto LAB_00441c8d;
            if ((uVar12 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar20],&local_a8);
            }
          }
          iVar9 = local_a8;
          if (local_a8 != 0) {
            (pCVar18->state).os_errno = local_a8;
            piVar16 = __errno_location();
            *piVar16 = iVar9;
            if (conn->tempaddr[lVar20] != (Curl_addrinfo *)0x0) {
              local_9c = uVar19;
              Curl_printable_address(conn->tempaddr[lVar20],local_68,0x2e);
              lVar1 = conn->port;
              pcVar17 = Curl_strerror(conn,local_a8);
              Curl_infof(pCVar18,"connect to %s port %ld failed: %s\n",local_68,lVar1,pcVar17);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[lVar20]->ai_next != (Curl_addrinfo *)0x0);
              CVar13 = trynextip(conn,local_a4,(uint)lVar20);
              pCVar18 = local_78;
              if ((CVar13 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_9c] == -1)) {
                local_a0 = CVar13;
              }
            }
          }
        }
        lVar20 = 1;
        bVar10 = false;
      } while (bVar8);
      CVar13 = CURLE_OK;
      if ((local_a0 != CURLE_OK) &&
         ((CVar14 = local_a0, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar14 = trynextip(conn,local_a4,1), CVar14 != CURLE_OK)))) {
        lVar20 = 0x118;
        if (((conn->bits).socksproxy == false) &&
           ((lVar20 = 0x158, (conn->bits).httpproxy == false &&
            (lVar20 = 0xd0, (conn->bits).conn_to_host != false)))) {
          lVar20 = 0xf8;
        }
        uVar2 = *(undefined8 *)((conn->chunk).hexbuffer + lVar20 + -0x20);
        lVar20 = conn->port;
        pcVar17 = Curl_strerror(conn,local_a8);
        Curl_failf(pCVar18,"Failed to connect to %s port %ld: %s",uVar2,lVar20,pcVar17);
        CVar13 = CVar14;
      }
    }
  }
  return CVar13;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    const char *hostname;

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
        hostname, conn->port, Curl_strerror(conn, error));
  }

  return result;
}